

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::Usd_IntegerCompression64::CompressToBuffer
                 (uint64_t *ints,size_t numInts,char *compressed,string *err)

{
  uint64_t uVar1;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> _Var2;
  mapped_type *pmVar3;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint64_t uVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  byte *pbVar16;
  bool bVar17;
  long lStack_a0;
  long local_78;
  unique_ptr<char[],_std::default_delete<char[]>_> encodeBuffer;
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  counts;
  
  if (numInts == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (numInts * 2 + 7 >> 3) + numInts * 8 + 8;
  }
  _Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(uVar11);
  encodeBuffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 _Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (numInts == 0) {
    sVar4 = 0;
  }
  else {
    counts._M_h._M_buckets = &counts._M_h._M_single_bucket;
    counts._M_h._M_bucket_count = 1;
    counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    counts._M_h._M_element_count = 0;
    counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    counts._M_h._M_rehash_policy._M_next_resize = 0;
    counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
    lVar10 = 0;
    uVar11 = 0;
    lVar13 = 0;
    for (lVar9 = 0; numInts * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
      local_78 = *(long *)((long)ints + lVar9) - lVar10;
      pmVar3 = ::std::__detail::
               _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&counts,&local_78);
      uVar7 = *pmVar3 + 1;
      *pmVar3 = uVar7;
      bVar17 = uVar7 == uVar11;
      lVar14 = local_78;
      if (((uVar7 <= uVar11) && (uVar7 = uVar11, lVar14 = lVar13, bVar17)) && (lVar13 < local_78)) {
        lVar14 = local_78;
      }
      lVar10 = *(long *)((long)ints + lVar9);
      uVar11 = uVar7;
      lVar13 = lVar14;
    }
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&counts._M_h);
    *(long *)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl = lVar13;
    pbVar16 = (byte *)((long)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl + 8);
    plVar8 = (long *)((numInts * 2 + 7 >> 3) +
                      (long)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                            super__Head_base<0UL,_char_*,_false>._M_head_impl + 8);
    uVar12 = 0;
LAB_002a14fb:
    switch(numInts) {
    case 0:
LAB_002a175a:
      sVar4 = (long)plVar8 -
              (long)_Var2.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                    super__Head_base<0UL,_char_*,_false>._M_head_impl;
      break;
    case 1:
      lVar10 = *ints - uVar12;
      if (lVar10 == lVar13) {
        bVar15 = 0;
      }
      else if ((short)lVar10 == lVar10) {
        *(short *)plVar8 = (short)lVar10;
        plVar8 = (long *)((long)plVar8 + 2);
        bVar15 = 1;
      }
      else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
        *plVar8 = lVar10;
        plVar8 = plVar8 + 1;
        bVar15 = 3;
      }
      else {
        *(int *)plVar8 = (int)lVar10;
        plVar8 = (long *)((long)plVar8 + 4);
        bVar15 = 2;
      }
      goto LAB_002a1757;
    case 2:
      uVar1 = *ints;
      lVar10 = uVar1 - uVar12;
      if (lVar10 == lVar13) {
        bVar15 = 0;
      }
      else if ((short)lVar10 == lVar10) {
        *(short *)plVar8 = (short)lVar10;
        plVar8 = (long *)((long)plVar8 + 2);
        bVar15 = 1;
      }
      else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
        *plVar8 = lVar10;
        plVar8 = plVar8 + 1;
        bVar15 = 3;
      }
      else {
        *(int *)plVar8 = (int)lVar10;
        plVar8 = (long *)((long)plVar8 + 4);
        bVar15 = 2;
      }
      lVar10 = ints[1] - uVar1;
      if (lVar10 != lVar13) {
        if ((short)lVar10 == lVar10) {
          *(short *)plVar8 = (short)lVar10;
          bVar5 = 4;
          lStack_a0 = 2;
        }
        else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
          *plVar8 = lVar10;
          bVar5 = 0xc;
          lStack_a0 = 8;
        }
        else {
          *(int *)plVar8 = (int)lVar10;
          bVar5 = 8;
          lStack_a0 = 4;
        }
        plVar8 = (long *)((long)plVar8 + lStack_a0);
        bVar15 = bVar15 | bVar5;
      }
      goto LAB_002a1757;
    case 3:
      bVar15 = 0;
      for (lVar10 = 0; (int)lVar10 != 6; lVar10 = lVar10 + 2) {
        uVar1 = *(uint64_t *)((long)ints + lVar10 * 4);
        lVar9 = uVar1 - uVar12;
        if (lVar9 != lVar13) {
          bVar5 = (byte)lVar10;
          if ((short)lVar9 == lVar9) {
            bVar5 = (byte)(1 << (bVar5 & 0x1f));
            *(short *)plVar8 = (short)lVar9;
            lVar9 = 2;
          }
          else if (lVar9 - 0x80000000U < 0xffffffff00000000) {
            bVar5 = (byte)(3 << (bVar5 & 0x1f));
            *plVar8 = lVar9;
            lVar9 = 8;
          }
          else {
            bVar5 = (byte)(2 << (bVar5 & 0x1f));
            *(int *)plVar8 = (int)lVar9;
            lVar9 = 4;
          }
          plVar8 = (long *)((long)plVar8 + lVar9);
          bVar15 = bVar15 | bVar5;
        }
        uVar12 = uVar1;
      }
LAB_002a1757:
      *pbVar16 = bVar15;
      goto LAB_002a175a;
    default:
      goto switchD_002a158d_default;
    }
  }
  sVar4 = LZ4Compression::CompressToBuffer
                    ((char *)encodeBuffer._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,compressed,sVar4,err)
  ;
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&encodeBuffer);
  return sVar4;
switchD_002a158d_default:
  bVar15 = 0;
  for (iVar6 = 0; iVar6 != 8; iVar6 = iVar6 + 2) {
    uVar1 = *ints;
    lVar10 = uVar1 - uVar12;
    if (lVar10 != lVar13) {
      bVar5 = (byte)iVar6;
      if ((short)lVar10 == lVar10) {
        bVar5 = (byte)(1 << (bVar5 & 0x1f));
        *(short *)plVar8 = (short)lVar10;
        lVar10 = 2;
      }
      else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
        bVar5 = (byte)(3 << (bVar5 & 0x1f));
        *plVar8 = lVar10;
        lVar10 = 8;
      }
      else {
        bVar5 = (byte)(2 << (bVar5 & 0x1f));
        *(int *)plVar8 = (int)lVar10;
        lVar10 = 4;
      }
      plVar8 = (long *)((long)plVar8 + lVar10);
      bVar15 = bVar15 | bVar5;
    }
    ints = ints + 1;
    uVar12 = uVar1;
  }
  *pbVar16 = bVar15;
  pbVar16 = pbVar16 + 1;
  numInts = numInts - 4;
  goto LAB_002a14fb;
}

Assistant:

size_t
Usd_IntegerCompression64::CompressToBuffer(
    uint64_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}